

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

void adiak_init(void *mpi_communicator_p)

{
  void *mpi_communicator_p_local;
  
  if (adiak_init::initialized == 0) {
    adiak_init::initialized = 1;
    adiak_common_init();
    adiak_config->reportable_rank = 1;
    adiak_config->use_mpi = 0;
  }
  return;
}

Assistant:

void adiak_init(void *mpi_communicator_p)
{
   static int initialized = 0;
   if (initialized)
      return;
   initialized = 1;

   adiak_common_init();

#if (USE_MPI)
   if (mpi_communicator_p && adksys_mpi_initialized()) {
      adksys_mpi_init(mpi_communicator_p);
      adiak_config->reportable_rank = adksys_reportable_rank();
      adiak_config->use_mpi = 1;
   }
   else
#endif
   do {
      adiak_config->reportable_rank = 1;
      adiak_config->use_mpi = 0;
      (void) mpi_communicator_p;
   } while (0);

}